

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O3

void __thiscall Assimp::LWOImporter::LoadLWO2VertexMap(LWOImporter *this,uint length,bool perPoly)

{
  pointer *ppaVar1;
  pointer *ppfVar2;
  ulong *puVar3;
  byte bVar4;
  ushort uVar5;
  pointer puVar6;
  iterator __position;
  pointer pVVar7;
  iterator iVar8;
  pointer pUVar9;
  pointer pWVar10;
  float fVar11;
  byte *pbVar12;
  bool bVar13;
  int iVar14;
  long *plVar15;
  undefined8 *puVar16;
  byte *pbVar17;
  uint *puVar18;
  ulong uVar19;
  float *pfVar20;
  Logger *pLVar21;
  runtime_error *this_00;
  byte bVar22;
  uint uVar23;
  long *plVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  aiVector3t<float> *__args;
  pointer pFVar28;
  ReferrerList *this_01;
  ushort uVar29;
  uint uVar30;
  Layer *pLVar31;
  byte *pbVar32;
  long lVar33;
  Layer *this_02;
  uint uVar34;
  VColorChannel *elem;
  pointer pVVar35;
  pointer pUVar36;
  pointer pWVar37;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  VMapEntry *local_210;
  uint *local_208;
  pointer local_200;
  ulong local_1f8;
  ulong local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ReferrerList *local_1d8;
  uint local_1cc;
  Layer *local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [376];
  
  if (length < 6) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"LWO: VMAP chunk is too small","");
    std::runtime_error::runtime_error(this_00,(string *)local_1a8);
    *(undefined ***)this_00 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_208 = (uint *)this->mFileBuffer;
  uVar34 = *local_208;
  this->mFileBuffer = (uint8_t *)(local_208 + 1);
  uVar5 = (ushort)local_208[1];
  pbVar17 = (byte *)((long)local_208 + 6);
  this->mFileBuffer = pbVar17;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  local_230._M_string_length = 0;
  local_230.field_2._M_local_buf[0] = '\0';
  pbVar32 = pbVar17;
  if (*(byte *)((long)local_208 + 6) != 0) {
    uVar23 = 1;
    pbVar12 = (byte *)((long)local_208 + 7);
    do {
      pbVar32 = pbVar12;
      if (length < uVar23) {
        pLVar21 = DefaultLogger::get();
        Logger::warn(pLVar21,"LWO: Invalid file, string is is too long");
        pbVar32 = this->mFileBuffer;
        break;
      }
      this->mFileBuffer = pbVar32;
      uVar23 = uVar23 + 1;
      pbVar12 = pbVar32 + 1;
    } while (*pbVar32 != 0);
  }
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pbVar17,pbVar32);
  local_1f0 = CONCAT44(local_1f0._4_4_,uVar34);
  uVar34 = uVar34 >> 0x18 | (uVar34 & 0xff0000) >> 8 | (uVar34 & 0xff00) << 8 | uVar34 << 0x18;
  uVar29 = uVar5 << 8 | uVar5 >> 8;
  std::__cxx11::string::operator=((string *)&local_230,(string *)local_1a8);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_);
  }
  this->mFileBuffer = this->mFileBuffer + (2 - (ulong)((int)pbVar32 - (int)pbVar17 & 1));
  if ((int)uVar34 < 0x52474220) {
    if ((int)uVar34 < 0x4e4f524d) {
      if (uVar34 == 0x4d4e5657) {
LAB_0042e26b:
        if (uVar5 != 0x100) {
          pLVar21 = DefaultLogger::get();
          std::operator+(&local_250,"LWO2: Skipping Weight Channel \'",&local_230);
          puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
          local_1a8._0_8_ = local_1a8 + 0x10;
          plVar15 = puVar16 + 2;
          if ((long *)*puVar16 == plVar15) {
            local_1a8._16_8_ = *plVar15;
            local_1a8._24_8_ = puVar16[3];
          }
          else {
            local_1a8._16_8_ = *plVar15;
            local_1a8._0_8_ = (long *)*puVar16;
          }
          local_1a8._8_8_ = puVar16[1];
          *puVar16 = plVar15;
          puVar16[1] = 0;
          *(undefined1 *)(puVar16 + 2) = 0;
          Logger::warn(pLVar21,(char *)local_1a8._0_8_);
          goto LAB_0042ee32;
        }
        lVar33 = 0x48;
        if ((int)local_1f0 == 0x54484757) {
          lVar33 = 0x30;
        }
        local_210 = FindEntry<Assimp::LWO::WeightChannel>
                              ((vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                *)((long)&(this->mCurLayer->mTempPoints).
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar33),
                               &local_230,perPoly);
LAB_0042e3d8:
        (*local_210->_vptr_VMapEntry[2])
                  (local_210,
                   (ulong)(uint)((int)((ulong)((long)(this->mCurLayer->mTempPoints).
                                                                                                          
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this->mCurLayer->mTempPoints).
                                                                                                        
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                -0x55555555));
        local_208 = (uint *)((long)local_208 + (ulong)length);
        uVar34 = local_210->dims;
        if ((uint)uVar29 <= local_210->dims) {
          uVar34 = (uint)uVar29;
        }
        uVar27 = (ulong)uVar34;
        puVar18 = (uint *)this->mFileBuffer;
        local_1e8 = uVar27;
        if (puVar18 < local_208) {
          this_02 = this->mCurLayer;
          this_01 = &this_02->mPointReferrers;
          local_1cc = (int)((ulong)((long)(this_02->mTempPoints).
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this_02->mTempPoints).
                                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                      -0x55555555;
          local_1c0 = (ulong)((long)(this_02->mFaces).
                                    super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_02->mFaces).
                                   super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5;
          local_1b8 = (ulong)((uVar29 - uVar34) * 4);
          local_1b0 = (ulong)(uVar34 * 4);
          local_1e0 = uVar27;
          local_1d8 = this_01;
          local_1c8 = this_02;
          do {
            uVar34 = *puVar18;
            pbVar17 = (byte *)((long)puVar18 + 1);
            this->mFileBuffer = pbVar17;
            if ((byte)uVar34 == 0xff) {
              bVar22 = *(byte *)((long)puVar18 + 1);
              this->mFileBuffer = (byte *)((long)puVar18 + 2);
              bVar4 = *(byte *)((long)puVar18 + 2);
              pbVar17 = (byte *)((long)puVar18 + 3);
              this->mFileBuffer = pbVar17;
              uVar34 = (uint)bVar4 << 8 | (uint)bVar22 << 0x10;
              lVar33 = 4;
            }
            else {
              uVar34 = (uint)(byte)uVar34 << 8;
              lVar33 = 2;
            }
            bVar22 = *pbVar17;
            pbVar17 = (byte *)((long)puVar18 + lVar33);
            this->mFileBuffer = pbVar17;
            uVar34 = (bVar22 | uVar34) + this->mCurLayer->mPointIDXOfs;
            uVar26 = (ulong)uVar34;
            if (uVar34 < local_1cc) {
              if (perPoly) {
                bVar22 = *pbVar17;
                pbVar32 = pbVar17 + 1;
                this->mFileBuffer = pbVar32;
                if (bVar22 == 0xff) {
                  bVar22 = pbVar17[1];
                  this->mFileBuffer = pbVar17 + 2;
                  bVar4 = pbVar17[2];
                  pbVar32 = pbVar17 + 3;
                  this->mFileBuffer = pbVar32;
                  uVar23 = (uint)bVar4 << 8 | (uint)bVar22 << 0x10;
                  lVar33 = 4;
                }
                else {
                  uVar23 = (uint)bVar22 << 8;
                  lVar33 = 2;
                }
                bVar22 = *pbVar32;
                this->mFileBuffer = pbVar17 + lVar33;
                if (((local_210->abAssigned).super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar34 >> 6] >>
                     (uVar26 & 0x3f) & 1) != 0) {
                  uVar34 = (uVar23 | bVar22) + this->mCurLayer->mFaceIDXOfs;
                  if ((uint)local_1c0 <= uVar34) {
                    pLVar21 = DefaultLogger::get();
                    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::basic_formatter<char[38]>
                              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                *)local_1a8,(char (*) [38])"LWO2: Failure evaluating VMAD entry \'")
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_230._M_dataplus._M_p,
                               local_230._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"\', polygon index is out of range",0x20);
                    std::__cxx11::stringbuf::str();
                    Logger::warn(pLVar21,local_250._M_dataplus._M_p);
                    goto LAB_0042e5bf;
                  }
                  pFVar28 = (this_02->mFaces).
                            super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (pFVar28[uVar34].super_aiFace.mNumIndices == 0) {
LAB_0042eee6:
                    pLVar21 = DefaultLogger::get();
                    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::basic_formatter<char[38]>
                              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                *)local_1a8,(char (*) [38])"LWO2: Failure evaluating VMAD entry \'")
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,local_230._M_dataplus._M_p,
                               local_230._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,"\', vertex index wasn\'t found in that polygon"
                               ,0x2c);
                    std::__cxx11::stringbuf::str();
                    Logger::warn(pLVar21,&local_250);
                    std::__cxx11::string::~string((string *)&local_250);
                    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::~basic_formatter((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_1a8);
                    __assert_fail("had",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOLoader.cpp"
                                  ,0x467,
                                  "void Assimp::LWOImporter::LoadLWO2VertexMap(unsigned int, bool)")
                    ;
                  }
                  pFVar28 = pFVar28 + uVar34;
                  uVar25 = 0;
                  bVar13 = false;
                  local_200 = pFVar28;
                  do {
                    uVar34 = (pFVar28->super_aiFace).mIndices[uVar25];
                    uVar19 = uVar26 & 0xffffffff;
                    do {
                      local_1f0 = uVar25;
                      if ((uint)uVar19 == uVar34) {
                        if (uVar34 != 0xffffffff) {
                          local_1a8._0_4_ = 0xffffffff;
                          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                                    (this_01,((long)(this_02->mPointReferrers).
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              (long)(this_02->mPointReferrers).
                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 2) +
                                             1,(value_type_conflict1 *)local_1a8);
                          uVar23 = (int)((ulong)((long)(this_02->mTempPoints).
                                                                                                              
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(this_02->mTempPoints).
                                                                                                            
                                                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                                   -0x55555555;
                          (local_200->super_aiFace).mIndices[local_1f0] = uVar23;
                          puVar6 = (this_02->mPointReferrers).
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
                          uVar27 = (ulong)uVar34;
                          do {
                            uVar26 = uVar27;
                            uVar30 = puVar6[uVar26];
                            uVar27 = (ulong)uVar30;
                          } while (uVar30 != 0xffffffff);
                          puVar6[uVar26] = (local_200->super_aiFace).mIndices[local_1f0];
                          __args = (this_02->mTempPoints).
                                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + uVar34;
                          __position._M_current =
                               (this_02->mTempPoints).
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              (this_02->mTempPoints).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
                            _M_realloc_insert<aiVector3t<float>const&>
                                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>
                                        *)this_02,__position,__args);
                          }
                          else {
                            (__position._M_current)->z = __args->z;
                            fVar11 = __args->y;
                            (__position._M_current)->x = __args->x;
                            (__position._M_current)->y = fVar11;
                            ppaVar1 = &(this_02->mTempPoints).
                                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish;
                            *ppaVar1 = *ppaVar1 + 1;
                          }
                          pLVar31 = this->mCurLayer;
                          pVVar35 = (pLVar31->mVColorChannels).
                                    super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pVVar7 = (pLVar31->mVColorChannels).
                                   super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          bVar22 = (byte)uVar34;
                          local_1f8 = (ulong)uVar23;
                          if (pVVar35 != pVVar7) {
                            do {
                              if ((pVVar35->super_VMapEntry).name._M_string_length != 0) {
                                puVar3 = (pVVar35->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar34 >> 6);
                                *puVar3 = *puVar3 | 1L << (bVar22 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pVVar35->super_VMapEntry).abAssigned,
                                           (ulong)(pVVar35->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pVVar35->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pVVar35->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar23 = (pVVar35->super_VMapEntry).dims;
                                if (uVar23 != 0) {
                                  uVar30 = 0;
                                  do {
                                    pfVar20 = (pVVar35->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar23 * uVar34 + uVar30);
                                    iVar8._M_current =
                                         (pVVar35->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar8._M_current ==
                                        (pVVar35->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pVVar35->super_VMapEntry).rawData,iVar8,pfVar20);
                                    }
                                    else {
                                      *iVar8._M_current = *pfVar20;
                                      ppfVar2 = &(pVVar35->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar2 = *ppfVar2 + 1;
                                    }
                                    uVar30 = uVar30 + 1;
                                    uVar23 = (pVVar35->super_VMapEntry).dims;
                                  } while (uVar30 < uVar23);
                                }
                              }
                              pVVar35 = pVVar35 + 1;
                            } while (pVVar35 != pVVar7);
                            pLVar31 = this->mCurLayer;
                          }
                          pUVar36 = (pLVar31->mUVChannels).
                                    super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pUVar9 = (pLVar31->mUVChannels).
                                   super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                          if (pUVar36 != pUVar9) {
                            do {
                              if ((pUVar36->super_VMapEntry).name._M_string_length != 0) {
                                puVar3 = (pUVar36->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar34 >> 6);
                                *puVar3 = *puVar3 | 1L << (bVar22 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pUVar36->super_VMapEntry).abAssigned,
                                           (ulong)(pUVar36->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pUVar36->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pUVar36->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar23 = (pUVar36->super_VMapEntry).dims;
                                if (uVar23 != 0) {
                                  uVar30 = 0;
                                  do {
                                    pfVar20 = (pUVar36->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar23 * uVar34 + uVar30);
                                    iVar8._M_current =
                                         (pUVar36->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar8._M_current ==
                                        (pUVar36->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pUVar36->super_VMapEntry).rawData,iVar8,pfVar20);
                                    }
                                    else {
                                      *iVar8._M_current = *pfVar20;
                                      ppfVar2 = &(pUVar36->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar2 = *ppfVar2 + 1;
                                    }
                                    uVar30 = uVar30 + 1;
                                    uVar23 = (pUVar36->super_VMapEntry).dims;
                                  } while (uVar30 < uVar23);
                                }
                              }
                              pUVar36 = pUVar36 + 1;
                            } while (pUVar36 != pUVar9);
                            pLVar31 = this->mCurLayer;
                          }
                          pWVar37 = (pLVar31->mWeightChannels).
                                    super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pWVar10 = (pLVar31->mWeightChannels).
                                    super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
                          if (pWVar37 != pWVar10) {
                            do {
                              if ((pWVar37->super_VMapEntry).name._M_string_length != 0) {
                                puVar3 = (pWVar37->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar34 >> 6);
                                *puVar3 = *puVar3 | 1L << (bVar22 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pWVar37->super_VMapEntry).abAssigned,
                                           (ulong)(pWVar37->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pWVar37->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pWVar37->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar23 = (pWVar37->super_VMapEntry).dims;
                                if (uVar23 != 0) {
                                  uVar30 = 0;
                                  do {
                                    pfVar20 = (pWVar37->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar23 * uVar34 + uVar30);
                                    iVar8._M_current =
                                         (pWVar37->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar8._M_current ==
                                        (pWVar37->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pWVar37->super_VMapEntry).rawData,iVar8,pfVar20);
                                    }
                                    else {
                                      *iVar8._M_current = *pfVar20;
                                      ppfVar2 = &(pWVar37->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar2 = *ppfVar2 + 1;
                                    }
                                    uVar30 = uVar30 + 1;
                                    uVar23 = (pWVar37->super_VMapEntry).dims;
                                  } while (uVar30 < uVar23);
                                }
                              }
                              pWVar37 = pWVar37 + 1;
                            } while (pWVar37 != pWVar10);
                            pLVar31 = this->mCurLayer;
                          }
                          pWVar37 = (pLVar31->mSWeightChannels).
                                    super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pWVar10 = (pLVar31->mSWeightChannels).
                                    super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                                    ._M_impl.super__Vector_impl_data._M_finish;
                          if (pWVar37 != pWVar10) {
                            do {
                              if ((pWVar37->super_VMapEntry).name._M_string_length != 0) {
                                puVar3 = (pWVar37->super_VMapEntry).abAssigned.
                                         super__Bvector_base<std::allocator<bool>_>._M_impl.
                                         super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                                         _M_p + (uVar34 >> 6);
                                *puVar3 = *puVar3 | 1L << (bVar22 & 0x3f);
                                std::vector<bool,_std::allocator<bool>_>::resize
                                          (&(pWVar37->super_VMapEntry).abAssigned,
                                           (ulong)(pWVar37->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_offset +
                                           ((long)(pWVar37->super_VMapEntry).abAssigned.
                                                  super__Bvector_base<std::allocator<bool>_>._M_impl
                                                  .super__Bvector_impl_data._M_finish.
                                                  super__Bit_iterator_base._M_p -
                                           (long)(pWVar37->super_VMapEntry).abAssigned.
                                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                                 super__Bvector_impl_data._M_start.
                                                 super__Bit_iterator_base._M_p) * 8 + 1,false);
                                uVar23 = (pWVar37->super_VMapEntry).dims;
                                if (uVar23 != 0) {
                                  uVar30 = 0;
                                  do {
                                    pfVar20 = (pWVar37->super_VMapEntry).rawData.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                              (uVar23 * uVar34 + uVar30);
                                    iVar8._M_current =
                                         (pWVar37->super_VMapEntry).rawData.
                                         super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                         super__Vector_impl_data._M_finish;
                                    if (iVar8._M_current ==
                                        (pWVar37->super_VMapEntry).rawData.
                                        super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage) {
                                      std::vector<float,std::allocator<float>>::
                                      _M_realloc_insert<float_const&>
                                                ((vector<float,std::allocator<float>> *)
                                                 &(pWVar37->super_VMapEntry).rawData,iVar8,pfVar20);
                                    }
                                    else {
                                      *iVar8._M_current = *pfVar20;
                                      ppfVar2 = &(pWVar37->super_VMapEntry).rawData.
                                                 super__Vector_base<float,_std::allocator<float>_>.
                                                 _M_impl.super__Vector_impl_data._M_finish;
                                      *ppfVar2 = *ppfVar2 + 1;
                                    }
                                    uVar30 = uVar30 + 1;
                                    uVar23 = (pWVar37->super_VMapEntry).dims;
                                  } while (uVar30 < uVar23);
                                }
                              }
                              pWVar37 = pWVar37 + 1;
                            } while (pWVar37 != pWVar10);
                            pLVar31 = this->mCurLayer;
                          }
                          uVar26 = local_1f8;
                          bVar13 = true;
                          pFVar28 = local_200;
                          this_01 = local_1d8;
                          this_02 = local_1c8;
                          uVar27 = local_1e0;
                          if ((pLVar31->mNormals).super_VMapEntry.name._M_string_length != 0) {
                            puVar3 = (pLVar31->mNormals).super_VMapEntry.abAssigned.
                                     super__Bvector_base<std::allocator<bool>_>._M_impl.
                                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                                     + (uVar34 >> 6);
                            *puVar3 = *puVar3 | 1L << (bVar22 & 0x3f);
                            std::vector<bool,_std::allocator<bool>_>::resize
                                      (&(pLVar31->mNormals).super_VMapEntry.abAssigned,
                                       (ulong)(pLVar31->mNormals).super_VMapEntry.abAssigned.
                                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                                              super__Bvector_impl_data._M_finish.
                                              super__Bit_iterator_base._M_offset +
                                       ((long)(pLVar31->mNormals).super_VMapEntry.abAssigned.
                                              super__Bvector_base<std::allocator<bool>_>._M_impl.
                                              super__Bvector_impl_data._M_finish.
                                              super__Bit_iterator_base._M_p -
                                       (long)(pLVar31->mNormals).super_VMapEntry.abAssigned.
                                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                                             super__Bvector_impl_data._M_start.
                                             super__Bit_iterator_base._M_p) * 8 + 1,false);
                            this_02 = local_1c8;
                            uVar23 = (pLVar31->mNormals).super_VMapEntry.dims;
                            pFVar28 = local_200;
                            this_01 = local_1d8;
                            uVar27 = local_1e0;
                            if (uVar23 != 0) {
                              uVar30 = 0;
                              do {
                                pfVar20 = (pLVar31->mNormals).super_VMapEntry.rawData.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start +
                                          (uVar23 * uVar34 + uVar30);
                                iVar8._M_current =
                                     (pLVar31->mNormals).super_VMapEntry.rawData.
                                     super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                     super__Vector_impl_data._M_finish;
                                if (iVar8._M_current ==
                                    (pLVar31->mNormals).super_VMapEntry.rawData.
                                    super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage) {
                                  std::vector<float,std::allocator<float>>::
                                  _M_realloc_insert<float_const&>
                                            ((vector<float,std::allocator<float>> *)
                                             &(pLVar31->mNormals).super_VMapEntry.rawData,iVar8,
                                             pfVar20);
                                }
                                else {
                                  *iVar8._M_current = *pfVar20;
                                  ppfVar2 = &(pLVar31->mNormals).super_VMapEntry.rawData.
                                             super__Vector_base<float,_std::allocator<float>_>.
                                             _M_impl.super__Vector_impl_data._M_finish;
                                  *ppfVar2 = *ppfVar2 + 1;
                                }
                                uVar30 = uVar30 + 1;
                                uVar23 = (pLVar31->mNormals).super_VMapEntry.dims;
                                pFVar28 = local_200;
                                this_01 = local_1d8;
                                uVar27 = local_1e0;
                              } while (uVar30 < uVar23);
                            }
                          }
                        }
                        break;
                      }
                      uVar23 = (this_01->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar19];
                      uVar19 = (ulong)uVar23;
                    } while (uVar23 != 0xffffffff);
                    uVar34 = (uint)uVar26;
                    uVar25 = local_1f0 + 1;
                  } while (uVar25 < (pFVar28->super_aiFace).mNumIndices);
                  if (!bVar13) goto LAB_0042eee6;
                }
              }
              pfVar20 = (float *)operator_new__(local_1b0);
              if ((uint)local_1e8 != 0) {
                uVar26 = 0;
                puVar18 = (uint *)this->mFileBuffer;
                do {
                  uVar23 = *puVar18;
                  this->mFileBuffer = (uint8_t *)(puVar18 + 1);
                  pfVar20[uVar26] =
                       (float)(uVar23 >> 0x18 | (uVar23 & 0xff0000) >> 8 | (uVar23 & 0xff00) << 8 |
                              uVar23 << 0x18);
                  uVar26 = uVar26 + 1;
                  puVar18 = puVar18 + 1;
                } while (uVar27 != uVar26);
              }
              DoRecursiveVMAPAssignment(this,local_210,(uint)local_1e8,uVar34,pfVar20);
              this->mFileBuffer = this->mFileBuffer + local_1b8;
              operator_delete__(pfVar20);
              puVar18 = (uint *)this->mFileBuffer;
            }
            else {
              pLVar21 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[43]>
                        ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1a8,(char (*) [43])"LWO2: Failure evaluating VMAP/VMAD entry \'");
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length)
              ;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"\', vertex index is out of range",0x1f);
              std::__cxx11::stringbuf::str();
              Logger::warn(pLVar21,local_250._M_dataplus._M_p);
LAB_0042e5bf:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
              puVar18 = (uint *)(this->mFileBuffer + (local_210->dims << 2));
              this->mFileBuffer = (uint8_t *)puVar18;
            }
          } while (puVar18 < local_208);
        }
        goto LAB_0042ee57;
      }
      if (uVar34 == 0x4d4f5246) goto LAB_0042ee57;
    }
    else {
      if (uVar34 == 0x4e4f524d) {
        iVar14 = std::__cxx11::string::compare((char *)&local_230);
        if ((uVar5 != 0x300 || iVar14 != 0) ||
           ((this->mCurLayer->mNormals).super_VMapEntry.name._M_string_length != 0))
        goto LAB_0042ee57;
        pLVar21 = DefaultLogger::get();
        Logger::info(pLVar21,"Processing non-standard extension: MODO VMAP.NORM.vert_normals");
        std::__cxx11::string::_M_assign((string *)&(this->mCurLayer->mNormals).super_VMapEntry.name)
        ;
        local_210 = &(this->mCurLayer->mNormals).super_VMapEntry;
        goto LAB_0042e3d8;
      }
      if (uVar34 == 0x5049434b) goto LAB_0042ee57;
    }
  }
  else if ((int)uVar34 < 0x53504f54) {
    if ((uVar34 == 0x52474220) || (uVar34 == 0x52474241)) {
      if (uVar29 - 5 < 0xfffffffe) {
        pLVar21 = DefaultLogger::get();
        std::operator+(&local_250,"LWO2: Skipping Color Map \'",&local_230);
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_250);
        local_1a8._0_8_ = local_1a8 + 0x10;
        plVar24 = plVar15 + 2;
        if ((long *)*plVar15 == plVar24) {
          local_1a8._16_8_ = *plVar24;
          local_1a8._24_8_ = plVar15[3];
        }
        else {
          local_1a8._16_8_ = *plVar24;
          local_1a8._0_8_ = (long *)*plVar15;
        }
        local_1a8._8_8_ = plVar15[1];
        *plVar15 = (long)plVar24;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        Logger::warn(pLVar21,(char *)local_1a8._0_8_);
LAB_0042ee32:
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p);
        }
        goto LAB_0042ee57;
      }
      local_210 = FindEntry<Assimp::LWO::VColorChannel>
                            (&this->mCurLayer->mVColorChannels,&local_230,perPoly);
      goto LAB_0042e3d8;
    }
  }
  else {
    if (uVar34 == 0x53504f54) goto LAB_0042ee57;
    if (uVar34 == 0x54585556) {
      if (uVar5 != 0x200) {
        pLVar21 = DefaultLogger::get();
        std::operator+(&local_250,"LWO2: Skipping UV channel \'",&local_230);
        puVar16 = (undefined8 *)std::__cxx11::string::append((char *)&local_250);
        local_1a8._0_8_ = local_1a8 + 0x10;
        plVar15 = puVar16 + 2;
        if ((long *)*puVar16 == plVar15) {
          local_1a8._16_8_ = *plVar15;
          local_1a8._24_8_ = puVar16[3];
        }
        else {
          local_1a8._16_8_ = *plVar15;
          local_1a8._0_8_ = (long *)*puVar16;
        }
        local_1a8._8_8_ = puVar16[1];
        *puVar16 = plVar15;
        puVar16[1] = 0;
        *(undefined1 *)(puVar16 + 2) = 0;
        Logger::warn(pLVar21,(char *)local_1a8._0_8_);
        goto LAB_0042ee32;
      }
      local_210 = FindEntry<Assimp::LWO::UVChannel>
                            (&this->mCurLayer->mUVChannels,&local_230,perPoly);
      goto LAB_0042e3d8;
    }
    if (uVar34 == 0x57474854) goto LAB_0042e26b;
  }
  std::__cxx11::string::compare((char *)&local_230);
  pLVar21 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[43]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [43])"LWO2: Skipping unknown VMAP/VMAD channel \'");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_230._M_dataplus._M_p,local_230._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
  std::__cxx11::stringbuf::str();
  Logger::warn(pLVar21,local_250._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
LAB_0042ee57:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LWOImporter::LoadLWO2VertexMap(unsigned int length, bool perPoly)
{
    LE_NCONST uint8_t* const end = mFileBuffer+length;

    AI_LWO_VALIDATE_CHUNK_LENGTH(length,VMAP,6);
    unsigned int type = GetU4();
    unsigned int dims = GetU2();

    VMapEntry* base;

    // read the name of the vertex map
    std::string name;
    GetS0(name,length);

    switch (type)
    {
    case AI_LWO_TXUV:
        if (dims != 2)  {
            ASSIMP_LOG_WARN("LWO2: Skipping UV channel \'"
            + name + "\' with !2 components");
            return;
        }
        base = FindEntry(mCurLayer->mUVChannels,name,perPoly);
        break;
    case AI_LWO_WGHT:
    case AI_LWO_MNVW:
        if (dims != 1)  {
            ASSIMP_LOG_WARN("LWO2: Skipping Weight Channel \'"
            + name + "\' with !1 components");
            return;
        }
        base = FindEntry((type == AI_LWO_WGHT ? mCurLayer->mWeightChannels
            : mCurLayer->mSWeightChannels),name,perPoly);
        break;
    case AI_LWO_RGB:
    case AI_LWO_RGBA:
        if (dims != 3 && dims != 4) {
            ASSIMP_LOG_WARN("LWO2: Skipping Color Map \'"
            + name + "\' with a dimension > 4 or < 3");
            return;
        }
        base = FindEntry(mCurLayer->mVColorChannels,name,perPoly);
        break;

    case AI_LWO_MODO_NORM:
        /*  This is a non-standard extension chunk used by Luxology's MODO.
         *  It stores per-vertex normals. This VMAP exists just once, has
         *  3 dimensions and is btw extremely beautiful.
         */
        if (name != "vert_normals" || dims != 3 || mCurLayer->mNormals.name.length())
            return;

        ASSIMP_LOG_INFO("Processing non-standard extension: MODO VMAP.NORM.vert_normals");

        mCurLayer->mNormals.name = name;
        base = & mCurLayer->mNormals;
        break;

    case AI_LWO_PICK: /* these VMAPs are just silently dropped */
    case AI_LWO_MORF:
    case AI_LWO_SPOT:
        return;

    default:
        if (name == "APS.Level") {
            // XXX handle this (seems to be subdivision-related).
        }
        ASSIMP_LOG_WARN_F("LWO2: Skipping unknown VMAP/VMAD channel \'", name, "\'");
        return;
    };
    base->Allocate((unsigned int)mCurLayer->mTempPoints.size());

    // now read all entries in the map
    type = std::min(dims,base->dims);
    const unsigned int diff = (dims - type)<<2u;

    LWO::FaceList& list = mCurLayer->mFaces;
    LWO::PointList& pointList = mCurLayer->mTempPoints;
    LWO::ReferrerList& refList = mCurLayer->mPointReferrers;

    const unsigned int numPoints = (unsigned int)pointList.size();
    const unsigned int numFaces  = (unsigned int)list.size();

    while (mFileBuffer < end)   {

        unsigned int idx = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mPointIDXOfs;
        if (idx >= numPoints)   {
            ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAP/VMAD entry \'", name, "\', vertex index is out of range");
            mFileBuffer += base->dims<<2u;
            continue;
        }
        if (perPoly)    {
            unsigned int polyIdx = ReadVSizedIntLWO2(mFileBuffer) + mCurLayer->mFaceIDXOfs;
            if (base->abAssigned[idx])  {
                // we have already a VMAP entry for this vertex - thus
                // we need to duplicate the corresponding polygon.
                if (polyIdx >= numFaces)    {
                    ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAD entry \'", name, "\', polygon index is out of range");
                    mFileBuffer += base->dims<<2u;
                    continue;
                }

                LWO::Face& src = list[polyIdx];

                // generate a new unique vertex for the corresponding index - but only
                // if we can find the index in the face
                bool had = false;
                for (unsigned int i = 0; i < src.mNumIndices;++i)   {

                    unsigned int srcIdx = src.mIndices[i], tmp = idx;
                    do {
                        if (tmp == srcIdx)
                            break;
                    }
                    while ((tmp = refList[tmp]) != UINT_MAX);
                    if (tmp == UINT_MAX) {
                        continue;
                    }

                    had = true;
                    refList.resize(refList.size()+1, UINT_MAX);

                    idx = (unsigned int)pointList.size();
                    src.mIndices[i] = (unsigned int)pointList.size();

                    // store the index of the new vertex in the old vertex
                    // so we get a single linked list we can traverse in
                    // only one direction
                    AddToSingleLinkedList(refList,srcIdx,src.mIndices[i]);
                    pointList.push_back(pointList[srcIdx]);

                    CreateNewEntry(mCurLayer->mVColorChannels,  srcIdx );
                    CreateNewEntry(mCurLayer->mUVChannels,      srcIdx );
                    CreateNewEntry(mCurLayer->mWeightChannels,  srcIdx );
                    CreateNewEntry(mCurLayer->mSWeightChannels, srcIdx );
                    CreateNewEntry(mCurLayer->mNormals, srcIdx );
                }
                if (!had) {
                    ASSIMP_LOG_WARN_F("LWO2: Failure evaluating VMAD entry \'", name, "\', vertex index wasn't found in that polygon");
                    ai_assert(had);
                }
            }
        }

        std::unique_ptr<float[]> temp(new float[type]);
        for (unsigned int l = 0; l < type;++l)
            temp[l] = GetF4();

        DoRecursiveVMAPAssignment(base,type,idx, temp.get());
        mFileBuffer += diff;
    }
}